

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O3

void __thiscall FNodeBuilder::ExtractMini(FNodeBuilder *this,FMiniBSP *bsp)

{
  TArray<vertex_t,_vertex_t> *this_00;
  uint *puVar1;
  TArray<subsector_t,_subsector_t> *this_01;
  TArray<node_t,_node_t> *this_02;
  TArray<seg_t,_seg_t> *this_03;
  undefined8 *puVar2;
  undefined8 uVar3;
  vertex_t *pvVar4;
  FPrivVert *pFVar5;
  node_t *pnVar6;
  subsector_t *psVar7;
  FPrivSeg *pFVar8;
  USegPtr *pUVar9;
  FLevel *pFVar10;
  seg_t *psVar11;
  undefined1 auVar12 [16];
  double dVar13;
  sector_t_conflict *psVar14;
  vertex_t *pvVar15;
  bool bVar16;
  int iVar17;
  glseg_t *pgVar18;
  long lVar19;
  ulong uVar20;
  sector_t_conflict **ppsVar21;
  uint uVar22;
  bool bVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  node_t *pnVar28;
  long lVar29;
  line_t_conflict *plVar30;
  side_t *psVar31;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> glsegs;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> local_48;
  
  bsp->bDirty = false;
  this_00 = &bsp->Verts;
  uVar22 = (this->Vertices).Count;
  puVar1 = &(bsp->Verts).Count;
  uVar24 = uVar22 - *puVar1;
  uVar25 = uVar22;
  if (*puVar1 <= uVar22 && uVar24 != 0) {
    TArray<vertex_t,_vertex_t>::Grow(this_00,uVar24);
    uVar25 = (this->Vertices).Count;
  }
  (bsp->Verts).Count = uVar22;
  if (uVar25 != 0) {
    pvVar4 = this_00->Array;
    pFVar5 = (this->Vertices).Array;
    lVar26 = 0;
    do {
      uVar3 = *(undefined8 *)((long)&(pFVar5->super_FSimpleVert).x + lVar26);
      dVar13 = (double)(int)((ulong)uVar3 >> 0x20) * 1.52587890625e-05;
      auVar12._8_4_ = SUB84(dVar13,0);
      auVar12._0_8_ = (double)(int)uVar3 * 1.52587890625e-05;
      auVar12._12_4_ = (int)((ulong)dVar13 >> 0x20);
      *(undefined1 (*) [16])((long)&(pvVar4->p).X + lVar26) = auVar12;
      lVar26 = lVar26 + 0x10;
    } while ((ulong)uVar25 << 4 != lVar26);
  }
  this_01 = &bsp->Subsectors;
  uVar22 = (this->Subsectors).Count;
  puVar1 = &(bsp->Subsectors).Count;
  uVar25 = uVar22 - *puVar1;
  if (*puVar1 <= uVar22 && uVar25 != 0) {
    TArray<subsector_t,_subsector_t>::Grow(this_01,uVar25);
  }
  (bsp->Subsectors).Count = uVar22;
  memset((bsp->Subsectors).Array,0,(ulong)(this->Subsectors).Count * 0x30);
  this_02 = &bsp->Nodes;
  uVar22 = (this->Nodes).Count;
  puVar1 = &(bsp->Nodes).Count;
  uVar25 = uVar22 - *puVar1;
  if (*puVar1 <= uVar22 && uVar25 != 0) {
    TArray<node_t,_node_t>::Grow(this_02,uVar25);
  }
  (bsp->Nodes).Count = uVar22;
  memcpy((bsp->Nodes).Array,(this->Nodes).Array,(ulong)(this->Nodes).Count * 0x48);
  if ((this->Nodes).Count != 0) {
    lVar26 = 0x10;
    lVar19 = 0;
    uVar20 = 0;
    do {
      lVar27 = 0;
      do {
        pnVar6 = this_02->Array;
        uVar22 = *(uint *)((long)&pnVar6->field_6 + lVar27 * 4 + lVar19 + 4);
        if ((int)uVar22 < 0) {
          pnVar28 = (node_t *)((long)&this_01->Array[uVar22 & 0x7fffffff].sector + 1);
        }
        else {
          pnVar28 = pnVar6 + uVar22;
        }
        *(node_t **)((long)&pnVar6->field_6 + lVar27 * 8 + lVar19 + 8) = pnVar28;
        lVar27 = lVar27 + -1;
      } while (lVar27 != -2);
      lVar27 = 0;
      bVar16 = true;
      do {
        bVar23 = bVar16;
        lVar27 = lVar27 * 0x10 + lVar26;
        lVar29 = 0;
        do {
          *(float *)((long)&this_02->Array->x + lVar29 * 4 + lVar27) =
               (float)*(int *)((long)&this_02->Array->x + lVar29 * 4 + lVar27) * 1.5258789e-05;
          lVar29 = lVar29 + 1;
        } while (lVar29 != 4);
        lVar27 = 1;
        bVar16 = false;
      } while (bVar23);
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x48;
      lVar26 = lVar26 + 0x48;
    } while (uVar20 < (this->Nodes).Count);
  }
  if (this->GLNodes != true) {
    memcpy((bsp->Subsectors).Array,(this->Subsectors).Array,(ulong)(this->Subsectors).Count * 0x30);
    this_03 = &bsp->Segs;
    uVar22 = (this->Segs).Count;
    puVar1 = &(bsp->Segs).Count;
    uVar24 = uVar22 - *puVar1;
    uVar25 = uVar22;
    if (*puVar1 <= uVar22 && uVar24 != 0) {
      TArray<seg_t,_seg_t>::Grow(this_03,uVar24);
      uVar25 = (this->Segs).Count;
    }
    (bsp->Segs).Count = uVar22;
    if (uVar25 != 0) {
      pFVar8 = (this->Segs).Array;
      pUVar9 = (this->SegList).Array;
      pvVar4 = this_00->Array;
      pFVar10 = this->Level;
      ppsVar21 = &this_03->Array->frontsector;
      uVar20 = 0;
      do {
        uVar22 = pUVar9[uVar20].SegNum;
        ((seg_t *)(ppsVar21 + -4))->v1 = pvVar4 + pFVar8[uVar22].v1;
        ppsVar21[-3] = (sector_t_conflict *)(pvVar4 + pFVar8[uVar22].v2);
        psVar14 = (&pFVar8[uVar22].frontsector)[1];
        *ppsVar21 = pFVar8[uVar22].frontsector;
        ppsVar21[1] = psVar14;
        if ((long)pFVar8[uVar22].sidedef == -1) {
          plVar30 = (line_t_conflict *)0x0;
          psVar31 = (side_t *)0x0;
        }
        else {
          plVar30 = pFVar10->Lines + pFVar8[uVar22].linedef;
          psVar31 = pFVar10->Sides + pFVar8[uVar22].sidedef;
        }
        ppsVar21[-1] = (sector_t_conflict *)plVar30;
        ppsVar21[-2] = (sector_t_conflict *)psVar31;
        uVar20 = uVar20 + 1;
        ppsVar21 = ppsVar21 + 6;
      } while (uVar25 != uVar20);
    }
    uVar20 = (ulong)(bsp->Subsectors).Count;
    if (uVar20 == 0) {
      return;
    }
    psVar7 = this_01->Array;
    psVar11 = this_03->Array;
    lVar26 = 0;
    do {
      *(seg_t **)((long)&psVar7->firstline + lVar26) =
           psVar11 + *(long *)((long)&psVar7->firstline + lVar26);
      lVar26 = lVar26 + 0x30;
    } while (uVar20 * 0x30 != lVar26);
    return;
  }
  local_48.Array = (glseg_t *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  if ((this->Subsectors).Count == 0) {
    uVar22 = 0;
  }
  else {
    lVar26 = 0x28;
    uVar20 = 0;
    do {
      iVar17 = CloseSubsector(this,&local_48,(int)uVar20,this_00->Array);
      psVar7 = (bsp->Subsectors).Array;
      *(int *)((long)&psVar7->sector + lVar26) = iVar17;
      uVar25 = (bsp->Segs).Count;
      *(seg_t **)((long)psVar7 + lVar26 + -0x10) = (bsp->Segs).Array + (uVar25 - iVar17);
      uVar20 = uVar20 + 1;
      lVar26 = lVar26 + 0x30;
    } while (uVar20 < (this->Subsectors).Count);
    uVar22 = local_48.Count;
    if (local_48.Count < uVar25 || local_48.Count - uVar25 == 0) goto LAB_003a9e5e;
    TArray<seg_t,_seg_t>::Grow(&bsp->Segs,local_48.Count - uVar25);
  }
LAB_003a9e5e:
  (bsp->Segs).Count = uVar22;
  if (local_48.Count != 0) {
    lVar26 = 0;
    pgVar18 = local_48.Array;
    do {
      psVar11 = (bsp->Segs).Array;
      pvVar4 = (pgVar18->super_seg_t).v1;
      pvVar15 = (pgVar18->super_seg_t).v2;
      psVar31 = (pgVar18->super_seg_t).sidedef;
      plVar30 = (pgVar18->super_seg_t).linedef;
      psVar14 = (pgVar18->super_seg_t).backsector;
      puVar2 = (undefined8 *)((long)&psVar11->frontsector + lVar26);
      *puVar2 = (pgVar18->super_seg_t).frontsector;
      puVar2[1] = psVar14;
      puVar2 = (undefined8 *)((long)&psVar11->sidedef + lVar26);
      *puVar2 = psVar31;
      puVar2[1] = plVar30;
      puVar2 = (undefined8 *)((long)&psVar11->v1 + lVar26);
      *puVar2 = pvVar4;
      puVar2[1] = pvVar15;
      pgVar18 = pgVar18 + 1;
      lVar26 = lVar26 + 0x30;
    } while ((ulong)local_48.Count * 0x30 != lVar26);
  }
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray(&local_48);
  return;
}

Assistant:

void FNodeBuilder::ExtractMini (FMiniBSP *bsp)
{
	unsigned int i;

	bsp->bDirty = false;
	bsp->Verts.Resize(Vertices.Size());
	for (i = 0; i < Vertices.Size(); ++i)
	{
		bsp->Verts[i].set(Vertices[i].x, Vertices[i].y);
	}

	bsp->Subsectors.Resize(Subsectors.Size());
	memset(&bsp->Subsectors[0], 0, Subsectors.Size() * sizeof(subsector_t));

	bsp->Nodes.Resize(Nodes.Size());
	memcpy(&bsp->Nodes[0], &Nodes[0], Nodes.Size()*sizeof(node_t));
	for (i = 0; i < Nodes.Size(); ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:\n", i));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (bsp->Nodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", bsp->Nodes[i].intchildren[j] & 0x7FFFFFFF));
				bsp->Nodes[i].children[j] = (BYTE *)&bsp->Subsectors[bsp->Nodes[i].intchildren[j] & 0x7fffffff] + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", bsp->Nodes[i].intchildren[j]));
				bsp->Nodes[i].children[j] = &bsp->Nodes[bsp->Nodes[i].intchildren[j]];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				bsp->Nodes[i].bbox[j][k] = FIXED2FLOAT(bsp->Nodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> glsegs;
		for (i = 0; i < Subsectors.Size(); ++i)
		{
			DWORD numsegs = CloseSubsector (glsegs, i, &bsp->Verts[0]);
			bsp->Subsectors[i].numlines = numsegs;
			bsp->Subsectors[i].firstline = &bsp->Segs[bsp->Segs.Size() - numsegs];
		}
		bsp->Segs.Resize(glsegs.Size());
		for (i = 0; i < glsegs.Size(); ++i)
		{
			bsp->Segs[i] = *(seg_t *)&glsegs[i];
		}
	}
	else
	{
		memcpy(&bsp->Subsectors[0], &Subsectors[0], Subsectors.Size()*sizeof(subsector_t));
		bsp->Segs.Resize(Segs.Size());
		for (i = 0; i < Segs.Size(); ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &bsp->Segs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = &bsp->Verts[org->v1];
			out->v2 = &bsp->Verts[org->v2];
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			if (org->sidedef != int(NO_SIDE))
			{
				out->linedef = Level.Lines + org->linedef;
				out->sidedef = Level.Sides + org->sidedef;
			}
			else	// part of a miniseg
			{
				out->linedef = NULL;
				out->sidedef = NULL;
			}
		}
		for (i = 0; i < bsp->Subsectors.Size(); ++i)
		{
			bsp->Subsectors[i].firstline = &bsp->Segs[(size_t)bsp->Subsectors[i].firstline];
		}
	}
}